

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O0

void lysc_update_path(lysc_ctx *ctx,lys_module *parent_module,char *name)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  char local_25;
  int local_24;
  uint8_t nextlevel;
  int len;
  char *name_local;
  lys_module *parent_module_local;
  lysc_ctx *ctx_local;
  
  local_25 = '\0';
  if (name != (char *)0x0) {
    if (1 < ctx->path_len) {
      if (((parent_module == (lys_module *)0x0) && (ctx->path[ctx->path_len - 1] == '}')) &&
         (ctx->path[ctx->path_len - 2] != '\'')) {
        local_25 = '\x02';
        ctx->path_len = ctx->path_len - 1;
      }
      else {
        local_25 = '\x01';
      }
    }
    if (local_25 == '\x02') {
      local_24 = snprintf(ctx->path + ctx->path_len,(ulong)(0xfee - ctx->path_len),"=\'%s\'}",name);
    }
    else if (((parent_module == (lys_module *)0x0) || (parent_module != ctx->cur_mod)) &&
            ((parent_module != (lys_module *)0x0 || ((ctx->path_len < 2 || (*name != '{')))))) {
      pcVar2 = "\t";
      if (local_25 != '\0') {
        pcVar2 = "//";
      }
      local_24 = snprintf(ctx->path + ctx->path_len,(ulong)(0xfee - ctx->path_len),"%s%s:%s",
                          pcVar2 + 1,ctx->cur_mod->name,name);
    }
    else {
      pcVar2 = "\t";
      if (local_25 != '\0') {
        pcVar2 = "//";
      }
      local_24 = snprintf(ctx->path + ctx->path_len,(ulong)(0xfee - ctx->path_len),"%s%s",pcVar2 + 1
                          ,name);
    }
    if (local_24 < (int)(0xfee - ctx->path_len)) {
      ctx->path_len = local_24 + ctx->path_len;
    }
    else {
      ctx->path_len = 0xfed;
    }
    goto LAB_0016083c;
  }
  if (ctx->path[ctx->path_len - 1] == '}') {
    while( true ) {
      bVar3 = false;
      if (ctx->path[ctx->path_len] != '=') {
        bVar3 = ctx->path[ctx->path_len] != '{';
      }
      if (!bVar3) break;
      ctx->path_len = ctx->path_len - 1;
    }
    if (ctx->path[ctx->path_len] != '=') goto LAB_001605e0;
    uVar1 = ctx->path_len;
    ctx->path_len = uVar1 + 1;
    ctx->path[uVar1] = '}';
  }
  else {
LAB_001605e0:
    while (ctx->path[ctx->path_len] != '/') {
      ctx->path_len = ctx->path_len - 1;
    }
    if (ctx->path_len == 0) {
      ctx->path_len = 1;
    }
  }
  ctx->path[ctx->path_len] = '\0';
LAB_0016083c:
  ly_log_location_revert(0,0,1,0);
  ly_log_location((lysc_node *)0x0,(lyd_node *)0x0,ctx->path,(ly_in *)0x0);
  return;
}

Assistant:

void
lysc_update_path(struct lysc_ctx *ctx, const struct lys_module *parent_module, const char *name)
{
    int len;
    uint8_t nextlevel = 0; /* 0 - no starttag, 1 - '/' starttag, 2 - '=' starttag + '}' endtag */

    if (!name) {
        /* removing last path segment */
        if (ctx->path[ctx->path_len - 1] == '}') {
            for ( ; ctx->path[ctx->path_len] != '=' && ctx->path[ctx->path_len] != '{'; --ctx->path_len) {}
            if (ctx->path[ctx->path_len] == '=') {
                ctx->path[ctx->path_len++] = '}';
            } else {
                /* not a top-level special tag, remove also preceiding '/' */
                goto remove_nodelevel;
            }
        } else {
remove_nodelevel:
            for ( ; ctx->path[ctx->path_len] != '/'; --ctx->path_len) {}
            if (ctx->path_len == 0) {
                /* top-level (last segment) */
                ctx->path_len = 1;
            }
        }
        /* set new terminating NULL-byte */
        ctx->path[ctx->path_len] = '\0';
    } else {
        if (ctx->path_len > 1) {
            if (!parent_module && (ctx->path[ctx->path_len - 1] == '}') && (ctx->path[ctx->path_len - 2] != '\'')) {
                /* extension of the special tag */
                nextlevel = 2;
                --ctx->path_len;
            } else {
                /* there is already some path, so add next level */
                nextlevel = 1;
            }
        } /* else the path is just initiated with '/', so do not add additional slash in case of top-level nodes */

        if (nextlevel != 2) {
            if ((parent_module && (parent_module == ctx->cur_mod)) || (!parent_module && (ctx->path_len > 1) && (name[0] == '{'))) {
                /* module not changed, print the name unprefixed */
                len = snprintf(&ctx->path[ctx->path_len], LYSC_CTX_BUFSIZE - ctx->path_len, "%s%s",
                        nextlevel ? "/" : "", name);
            } else {
                len = snprintf(&ctx->path[ctx->path_len], LYSC_CTX_BUFSIZE - ctx->path_len, "%s%s:%s",
                        nextlevel ? "/" : "", ctx->cur_mod->name, name);
            }
        } else {
            len = snprintf(&ctx->path[ctx->path_len], LYSC_CTX_BUFSIZE - ctx->path_len, "='%s'}", name);
        }
        if (len >= LYSC_CTX_BUFSIZE - (int)ctx->path_len) {
            /* output truncated */
            ctx->path_len = LYSC_CTX_BUFSIZE - 1;
        } else {
            ctx->path_len += len;
        }
    }

    ly_log_location_revert(0, 0, 1, 0);
    ly_log_location(NULL, NULL, ctx->path, NULL);
}